

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesVFManagementGetVFCapabilitiesExp
          (zes_vf_handle_t hVFhandle,zes_vf_exp_capabilities_t *pCapability)

{
  zes_pfnVFManagementGetVFCapabilitiesExp_t pfnGetVFCapabilitiesExp;
  dditable_t *dditable;
  ze_result_t result;
  zes_vf_exp_capabilities_t *pCapability_local;
  zes_vf_handle_t hVFhandle_local;
  
  if (*(code **)(*(long *)(hVFhandle + 8) + 0xd08) == (code *)0x0) {
    hVFhandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hVFhandle_local._4_4_ =
         (**(code **)(*(long *)(hVFhandle + 8) + 0xd08))(*(undefined8 *)hVFhandle,pCapability);
  }
  return hVFhandle_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementGetVFCapabilitiesExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp_capabilities_t* pCapability          ///< [in,out] Will contain VF capability.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_vf_object_t*>( hVFhandle )->dditable;
        auto pfnGetVFCapabilitiesExp = dditable->zes.VFManagementExp.pfnGetVFCapabilitiesExp;
        if( nullptr == pfnGetVFCapabilitiesExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hVFhandle = reinterpret_cast<zes_vf_object_t*>( hVFhandle )->handle;

        // forward to device-driver
        result = pfnGetVFCapabilitiesExp( hVFhandle, pCapability );

        return result;
    }